

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_field_misc(void)

{
  int iVar1;
  uint64_t uVar2;
  secp256k1_fe_storage zs;
  secp256k1_fe_storage ys;
  secp256k1_fe_storage xs;
  int j;
  int i;
  secp256k1_fe fe5;
  int v;
  secp256k1_fe q;
  secp256k1_fe z;
  secp256k1_fe y;
  secp256k1_fe x;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  secp256k1_fe *in_stack_fffffffffffffed0;
  secp256k1_fe *in_stack_fffffffffffffee0;
  secp256k1_fe *in_stack_fffffffffffffee8;
  secp256k1_fe *in_stack_fffffffffffffef0;
  undefined1 local_f8 [16];
  secp256k1_fe *in_stack_ffffffffffffff18;
  secp256k1_fe *in_stack_ffffffffffffff20;
  uint local_d8;
  uint local_d4;
  undefined8 local_d0 [5];
  int local_a4;
  secp256k1_fe local_a0;
  secp256k1_fe local_78;
  secp256k1_fe local_50;
  secp256k1_fe local_28;
  
  memset(local_d0,0,0x28);
  local_d0[0] = 5;
  local_d4 = 0;
  while( true ) {
    if (SBORROW4(local_d4,COUNT * 1000) == (int)(local_d4 + COUNT * -1000) < 0) {
      return;
    }
    if ((local_d4 & 1) == 0) {
      random_fe_test(in_stack_fffffffffffffee0);
    }
    else {
      random_fe(in_stack_fffffffffffffee0);
    }
    random_fe_non_zero(in_stack_fffffffffffffed0);
    uVar2 = secp256k1_testrand_bits(in_stack_fffffffffffffecc);
    local_a4 = (int)uVar2;
    secp256k1_fe_impl_set_int(&local_a0,local_a4);
    memcpy(&local_78,&local_28,0x28);
    secp256k1_fe_impl_add(&local_78,&local_a0);
    memcpy(&local_a0,&local_28,0x28);
    secp256k1_fe_impl_add_int(&local_a0,local_a4);
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xc8a,"test condition failed: check_fe_equal(&q, &z)");
      abort();
    }
    iVar1 = secp256k1_fe_impl_cmp_var(&local_28,&local_28);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xc8c,"test condition failed: secp256k1_fe_cmp_var(&x, &x) == 0");
      abort();
    }
    iVar1 = secp256k1_fe_equal_var(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xc8d,"test condition failed: secp256k1_fe_equal_var(&x, &x)");
      abort();
    }
    memcpy(&local_78,&local_28,0x28);
    secp256k1_fe_impl_add(&local_78,&local_50);
    memcpy(&local_a0,&local_28,0x28);
    secp256k1_fe_impl_cmov(&local_28,&local_78,0);
    memcpy(&local_28,&local_a0,0x28);
    secp256k1_fe_impl_cmov(&local_28,&local_28,1);
    iVar1 = fe_identical(in_stack_fffffffffffffed0,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xc9a,"test condition failed: !fe_identical(&x, &z)");
      abort();
    }
    iVar1 = fe_identical(in_stack_fffffffffffffed0,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xc9b,"test condition failed: fe_identical(&x, &q)");
      abort();
    }
    secp256k1_fe_impl_cmov(&local_a0,&local_78,1);
    iVar1 = fe_identical(in_stack_fffffffffffffed0,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xca2,"test condition failed: fe_identical(&q, &z)");
      abort();
    }
    memcpy(&local_a0,&local_78,0x28);
    secp256k1_fe_impl_normalize_var(&local_28);
    secp256k1_fe_impl_normalize_var(&local_78);
    iVar1 = secp256k1_fe_equal_var(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (iVar1 != 0) break;
    secp256k1_fe_impl_normalize_var(&local_a0);
    secp256k1_fe_impl_cmov(&local_a0,&local_78,local_d4 & 1);
    for (local_d8 = 0; (int)local_d8 < 6; local_d8 = local_d8 + 1) {
      secp256k1_fe_impl_negate_unchecked(&local_78,&local_78,local_d8 + 1);
      secp256k1_fe_impl_normalize_var(&local_a0);
      secp256k1_fe_impl_cmov(&local_a0,&local_78,local_d8 & 1);
    }
    secp256k1_fe_impl_normalize_var(&local_78);
    secp256k1_fe_impl_to_storage((secp256k1_fe_storage *)local_f8,&local_28);
    secp256k1_fe_impl_to_storage((secp256k1_fe_storage *)&stack0xfffffffffffffee8,&local_50);
    secp256k1_fe_impl_to_storage((secp256k1_fe_storage *)&stack0xfffffffffffffec8,&local_78);
    secp256k1_fe_storage_cmov
              ((secp256k1_fe_storage *)&stack0xfffffffffffffec8,(secp256k1_fe_storage *)local_f8,0);
    secp256k1_fe_storage_cmov
              ((secp256k1_fe_storage *)&stack0xfffffffffffffec8,
               (secp256k1_fe_storage *)&stack0xfffffffffffffec8,1);
    iVar1 = secp256k1_memcmp_var(local_f8,&stack0xfffffffffffffec8,0x20);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcbb,"test condition failed: secp256k1_memcmp_var(&xs, &zs, sizeof(xs)) != 0");
      abort();
    }
    secp256k1_fe_storage_cmov
              ((secp256k1_fe_storage *)&stack0xfffffffffffffee8,(secp256k1_fe_storage *)local_f8,1);
    iVar1 = secp256k1_memcmp_var(local_f8,&stack0xfffffffffffffee8,0x20);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcbd,"test condition failed: secp256k1_memcmp_var(&xs, &ys, sizeof(xs)) == 0");
      abort();
    }
    secp256k1_fe_impl_from_storage(&local_28,(secp256k1_fe_storage *)local_f8);
    secp256k1_fe_impl_from_storage(&local_50,(secp256k1_fe_storage *)&stack0xfffffffffffffee8);
    secp256k1_fe_impl_from_storage(&local_78,(secp256k1_fe_storage *)&stack0xfffffffffffffec8);
    secp256k1_fe_impl_add(&local_50,&local_28);
    secp256k1_fe_impl_add(&local_50,&local_28);
    memcpy(&local_78,&local_28,0x28);
    secp256k1_fe_impl_mul_int_unchecked(&local_78,3);
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcc6,"test condition failed: check_fe_equal(&y, &z)");
      abort();
    }
    secp256k1_fe_impl_add(&local_50,&local_28);
    secp256k1_fe_impl_add(&local_78,&local_28);
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcc9,"test condition failed: check_fe_equal(&z, &y)");
      abort();
    }
    memcpy(&local_78,&local_28,0x28);
    secp256k1_fe_impl_mul_int_unchecked(&local_78,5);
    secp256k1_fe_impl_mul
              (in_stack_fffffffffffffed0,
               (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (secp256k1_fe *)0x11426e);
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xccd,"test condition failed: check_fe_equal(&z, &q)");
      abort();
    }
    secp256k1_fe_impl_negate_unchecked(&local_28,&local_28,1);
    secp256k1_fe_impl_add(&local_78,&local_28);
    secp256k1_fe_impl_add(&local_a0,&local_28);
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcd1,"test condition failed: check_fe_equal(&y, &z)");
      abort();
    }
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcd2,"test condition failed: check_fe_equal(&q, &y)");
      abort();
    }
    memcpy(&local_78,&local_28,0x28);
    secp256k1_fe_impl_half(&local_78);
    secp256k1_fe_impl_add(&local_78,&local_78);
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcd7,"test condition failed: check_fe_equal(&x, &z)");
      abort();
    }
    secp256k1_fe_impl_add(&local_78,&local_78);
    secp256k1_fe_impl_half(&local_78);
    iVar1 = check_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xcda,"test condition failed: check_fe_equal(&x, &z)");
      abort();
    }
    local_d4 = local_d4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0xca6,"test condition failed: !secp256k1_fe_equal_var(&x, &z)");
  abort();
}

Assistant:

static void run_field_misc(void) {
    secp256k1_fe x;
    secp256k1_fe y;
    secp256k1_fe z;
    secp256k1_fe q;
    int v;
    secp256k1_fe fe5 = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 5);
    int i, j;
    for (i = 0; i < 1000 * COUNT; i++) {
        secp256k1_fe_storage xs, ys, zs;
        if (i & 1) {
            random_fe(&x);
        } else {
            random_fe_test(&x);
        }
        random_fe_non_zero(&y);
        v = secp256k1_testrand_bits(15);
        /* Test that fe_add_int is equivalent to fe_set_int + fe_add. */
        secp256k1_fe_set_int(&q, v); /* q = v */
        z = x; /* z = x */
        secp256k1_fe_add(&z, &q); /* z = x+v */
        q = x; /* q = x */
        secp256k1_fe_add_int(&q, v); /* q = x+v */
        CHECK(check_fe_equal(&q, &z));
        /* Test the fe equality and comparison operations. */
        CHECK(secp256k1_fe_cmp_var(&x, &x) == 0);
        CHECK(secp256k1_fe_equal_var(&x, &x));
        z = x;
        secp256k1_fe_add(&z,&y);
        /* Test fe conditional move; z is not normalized here. */
        q = x;
        secp256k1_fe_cmov(&x, &z, 0);
#ifdef VERIFY
        CHECK(!x.normalized);
        CHECK((x.magnitude == q.magnitude) || (x.magnitude == z.magnitude));
        CHECK((x.magnitude >= q.magnitude) && (x.magnitude >= z.magnitude));
#endif
        x = q;
        secp256k1_fe_cmov(&x, &x, 1);
        CHECK(!fe_identical(&x, &z));
        CHECK(fe_identical(&x, &q));
        secp256k1_fe_cmov(&q, &z, 1);
#ifdef VERIFY
        CHECK(!q.normalized);
        CHECK((q.magnitude == x.magnitude) || (q.magnitude == z.magnitude));
        CHECK((q.magnitude >= x.magnitude) && (q.magnitude >= z.magnitude));
#endif
        CHECK(fe_identical(&q, &z));
        q = z;
        secp256k1_fe_normalize_var(&x);
        secp256k1_fe_normalize_var(&z);
        CHECK(!secp256k1_fe_equal_var(&x, &z));
        secp256k1_fe_normalize_var(&q);
        secp256k1_fe_cmov(&q, &z, (i&1));
#ifdef VERIFY
        CHECK(q.normalized && q.magnitude == 1);
#endif
        for (j = 0; j < 6; j++) {
            secp256k1_fe_negate_unchecked(&z, &z, j+1);
            secp256k1_fe_normalize_var(&q);
            secp256k1_fe_cmov(&q, &z, (j&1));
#ifdef VERIFY
            CHECK(!q.normalized && q.magnitude == z.magnitude);
#endif
        }
        secp256k1_fe_normalize_var(&z);
        /* Test storage conversion and conditional moves. */
        secp256k1_fe_to_storage(&xs, &x);
        secp256k1_fe_to_storage(&ys, &y);
        secp256k1_fe_to_storage(&zs, &z);
        secp256k1_fe_storage_cmov(&zs, &xs, 0);
        secp256k1_fe_storage_cmov(&zs, &zs, 1);
        CHECK(secp256k1_memcmp_var(&xs, &zs, sizeof(xs)) != 0);
        secp256k1_fe_storage_cmov(&ys, &xs, 1);
        CHECK(secp256k1_memcmp_var(&xs, &ys, sizeof(xs)) == 0);
        secp256k1_fe_from_storage(&x, &xs);
        secp256k1_fe_from_storage(&y, &ys);
        secp256k1_fe_from_storage(&z, &zs);
        /* Test that mul_int, mul, and add agree. */
        secp256k1_fe_add(&y, &x);
        secp256k1_fe_add(&y, &x);
        z = x;
        secp256k1_fe_mul_int(&z, 3);
        CHECK(check_fe_equal(&y, &z));
        secp256k1_fe_add(&y, &x);
        secp256k1_fe_add(&z, &x);
        CHECK(check_fe_equal(&z, &y));
        z = x;
        secp256k1_fe_mul_int(&z, 5);
        secp256k1_fe_mul(&q, &x, &fe5);
        CHECK(check_fe_equal(&z, &q));
        secp256k1_fe_negate(&x, &x, 1);
        secp256k1_fe_add(&z, &x);
        secp256k1_fe_add(&q, &x);
        CHECK(check_fe_equal(&y, &z));
        CHECK(check_fe_equal(&q, &y));
        /* Check secp256k1_fe_half. */
        z = x;
        secp256k1_fe_half(&z);
        secp256k1_fe_add(&z, &z);
        CHECK(check_fe_equal(&x, &z));
        secp256k1_fe_add(&z, &z);
        secp256k1_fe_half(&z);
        CHECK(check_fe_equal(&x, &z));
    }
}